

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

Token * __thiscall enact::Lexer::identifier(Token *__return_storage_ptr__,Lexer *this)

{
  char c;
  bool bVar1;
  TokenType type;
  string local_38;
  Lexer *local_18;
  Lexer *this_local;
  
  local_18 = this;
  this_local = (Lexer *)__return_storage_ptr__;
  while( true ) {
    c = peek(this);
    bVar1 = isIdentifier(this,c);
    if (!bVar1) break;
    advance(this);
  }
  std::__cxx11::string::substr((ulong)&local_38,(ulong)this);
  type = getIdentifierType(this,&local_38);
  makeToken(__return_storage_ptr__,this,type);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::identifier() {
        while (isIdentifier(peek())) advance();
        return makeToken(getIdentifierType(m_source.substr(m_start, m_current - m_start)));
    }